

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_kinematics.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  void *pvVar5;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pDVar6;
  Matrix4d *pMVar7;
  byte bVar8;
  Vector6d theta;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  theta_q;
  Matrix4d T;
  double local_318 [6];
  Matrix4d local_2e8;
  Matrix4d local_268;
  Vector6d local_1e8;
  double *local_1b8 [16];
  Matrix4d local_138;
  Matrix4d local_b8;
  
  bVar8 = 0;
  lVar4 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  do {
    iVar1 = rand();
    local_318[lVar4] = ((double)(iVar1 % 100) / 100.0) * 3.141592653589793;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"theta: ",7);
  local_1b8[0] = local_318;
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                             local_1b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       local_318[0];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       local_318[1];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       local_318[2];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       local_318[3];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       local_318[4];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       local_318[5];
  forward_kinematics((Matrix4d *)local_1b8,&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T:\n",3);
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  transform(&local_2e8,1,local_318[1]);
  transform(&local_268,2,local_318[2]);
  transform(&local_b8,3,local_318[3]);
  pDVar6 = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1b8;
  pMVar7 = &local_138;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = *(double *)pDVar6;
    pDVar6 = pDVar6 + (ulong)bVar8 * -0x10 + 8;
    pMVar7 = (Matrix4d *)((long)pMVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  inverse_kinematics((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)&local_2e8,&local_138);
  if ((long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] -
      (long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] != 0) {
    lVar4 = ((long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1] -
             (long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0] >> 4) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    pvVar5 = (void *)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0];
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"theta_e: ",9);
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)pvVar5;
      poVar3 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                  *)&local_268);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pvVar5 = (void *)((long)pvVar5 + 0x30);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if ((void *)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] != (void *)0x0) {
    operator_delete((void *)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0],
                    (long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2] -
                    (long)local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0]);
  }
  return 0;
}

Assistant:

int main()
{

	srand(time(0));
	Vector6d theta;
	// theta <<  2.04204,  1.19381,  1.31947,  1.25664, 0.251327, 0.345575;
	for (int i = 0; i < 6; i++)
	{
		// theta(i) = 0;//i * M_PI / 2;
		theta(i) = rand() % 100 / 100.0 * M_PI;
	}

	cout << "theta: " << theta.transpose() << endl;

	Matrix4d T = forward_kinematics(theta);
	cout << "T:\n" << T << endl;
	Matrix4d T14 = transform(1, theta(1)) * transform(2, theta(2)) * transform(3, theta(3));
	vector<Vector6d> theta_q = inverse_kinematics(T);
	for(int i = 0; i < theta_q.size(); i++)
	{
		cout << "theta_e: " << theta_q[i].transpose() << endl;
	}
	return 0;
}